

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QListViewItem>::emplace<QListViewItem_const&>
          (QPodArrayOps<QListViewItem> *this,qsizetype i,QListViewItem *args)

{
  QListViewItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  qsizetype qVar11;
  QListViewItem *pQVar12;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QListViewItem>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QListViewItem>).size == i) &&
       (qVar11 = QArrayDataPointer<QListViewItem>::freeSpaceAtEnd
                           (&this->super_QArrayDataPointer<QListViewItem>), qVar11 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QListViewItem>).size;
      pQVar12 = (this->super_QArrayDataPointer<QListViewItem>).ptr;
      pQVar12[lVar4].visited = args->visited;
      iVar5 = args->y;
      sVar6 = args->w;
      sVar7 = args->h;
      iVar8 = args->indexHint;
      pQVar12 = pQVar12 + lVar4;
      pQVar12->x = args->x;
      pQVar12->y = iVar5;
      pQVar12->w = sVar6;
      pQVar12->h = sVar7;
      pQVar12->indexHint = iVar8;
    }
    else {
      if ((i != 0) ||
         (qVar11 = QArrayDataPointer<QListViewItem>::freeSpaceAtBegin
                             (&this->super_QArrayDataPointer<QListViewItem>), qVar11 == 0))
      goto LAB_0051f011;
      pQVar12 = (this->super_QArrayDataPointer<QListViewItem>).ptr;
      pQVar12[-1].visited = args->visited;
      iVar5 = args->y;
      sVar6 = args->w;
      sVar7 = args->h;
      iVar8 = args->indexHint;
      pQVar12[-1].x = args->x;
      pQVar12[-1].y = iVar5;
      pQVar12[-1].w = sVar6;
      pQVar12[-1].h = sVar7;
      pQVar12[-1].indexHint = iVar8;
      ppQVar1 = &(this->super_QArrayDataPointer<QListViewItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QListViewItem>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_0051f011:
  iVar9 = args->indexHint;
  uVar10 = args->visited;
  sVar6 = args->w;
  sVar7 = args->h;
  iVar5 = args->x;
  iVar8 = args->y;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QListViewItem>).size != 0);
  QArrayDataPointer<QListViewItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QListViewItem>,where,1,(QListViewItem **)0x0,
             (QArrayDataPointer<QListViewItem> *)0x0);
  pQVar12 = createHole(this,where,i,1);
  pQVar12->x = iVar5;
  pQVar12->y = iVar8;
  pQVar12->w = sVar6;
  pQVar12->h = sVar7;
  pQVar12->indexHint = iVar9;
  pQVar12->visited = uVar10;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }